

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O0

void __thiscall icu_63::RBBITableBuilder::~RBBITableBuilder(RBBITableBuilder *this)

{
  int32_t iVar1;
  RBBIStateDescriptor *this_00;
  void *p;
  uint local_14;
  int i;
  RBBITableBuilder *this_local;
  
  local_14 = 0;
  while( true ) {
    iVar1 = UVector::size(this->fDStates);
    if (iVar1 <= (int)local_14) break;
    p = (void *)(ulong)local_14;
    this_00 = (RBBIStateDescriptor *)UVector::elementAt(this->fDStates,local_14);
    if (this_00 != (RBBIStateDescriptor *)0x0) {
      RBBIStateDescriptor::~RBBIStateDescriptor(this_00);
      UMemory::operator_delete((UMemory *)this_00,p);
    }
    local_14 = local_14 + 1;
  }
  if (this->fDStates != (UVector *)0x0) {
    (*(this->fDStates->super_UObject)._vptr_UObject[1])();
  }
  if (this->fSafeTable != (UVector *)0x0) {
    (*(this->fSafeTable->super_UObject)._vptr_UObject[1])();
  }
  return;
}

Assistant:

RBBITableBuilder::~RBBITableBuilder() {
    int i;
    for (i=0; i<fDStates->size(); i++) {
        delete (RBBIStateDescriptor *)fDStates->elementAt(i);
    }
    delete fDStates;
    delete fSafeTable;
}